

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lfunc.c
# Opt level: O0

void luaF_close(lua_State *L,StkId level)

{
  global_State *g_00;
  bool bVar1;
  TValue *io1;
  TValue *io2;
  GCObject *o;
  global_State *g;
  UpVal *uv;
  StkId level_local;
  lua_State *L_local;
  
  g_00 = L->l_G;
  while( true ) {
    bVar1 = false;
    if (L->openupval != (GCObject *)0x0) {
      g = (global_State *)L->openupval;
      bVar1 = level <= ((Table *)g)->array;
    }
    if (!bVar1) break;
    L->openupval = (GCObject *)g->frealloc;
    if ((byte)((*(byte *)((long)&g->ud + 1) ^ 3) & (g_00->currentwhite ^ 3)) == 0) {
      luaF_freeupval(L,(UpVal *)g);
    }
    else {
      unlinkupval((UpVal *)g);
      g->GCdebt = *(l_mem *)g->totalbytes;
      *(int *)&g->GCmemtrav = (int)((l_mem *)g->totalbytes)[1];
      g->totalbytes = (lu_mem)&g->GCdebt;
      g->frealloc = (lua_Alloc)g_00->allgc;
      g_00->allgc = (GCObject *)g;
      luaC_checkupvalcolor(g_00,(UpVal *)g);
    }
  }
  return;
}

Assistant:

void luaF_close (lua_State *L, StkId level) {
  UpVal *uv;
  global_State *g = G(L);
  while (L->openupval != NULL && (uv = gco2uv(L->openupval))->v >= level) {
    GCObject *o = obj2gco(uv);
    lua_assert(!isblack(o) && uv->v != &uv->u.value);
    L->openupval = uv->next;  /* remove from `open' list */
    if (isdead(g, o))
      luaF_freeupval(L, uv);  /* free upvalue */
    else {
      unlinkupval(uv);  /* remove upvalue from 'uvhead' list */
      setobj(L, &uv->u.value, uv->v);  /* move value to upvalue slot */
      uv->v = &uv->u.value;  /* now current value lives here */
      gch(o)->next = g->allgc;  /* link upvalue into 'allgc' list */
      g->allgc = o;
      luaC_checkupvalcolor(g, uv);
    }
  }
}